

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O2

double regularizer_direction_magnitude<dense_parameters>
                 (vw *param_1,bfgs *b,double regularizer,dense_parameters *weights)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  bVar1 = (byte)weights->_stride_shift;
  uVar2 = 1L << (bVar1 & 0x3f);
  if (b->regularizers == (weight *)0x0) {
    dVar4 = 0.0;
    for (lVar3 = 0; weights->_weight_mask * 4 + 4 != lVar3; lVar3 = lVar3 + uVar2 * 4) {
      dVar5 = (double)*(float *)((long)weights->_begin + lVar3 + 8);
      dVar4 = dVar4 + dVar5 * regularizer * dVar5;
    }
  }
  else {
    dVar4 = 0.0;
    for (lVar3 = 0; weights->_weight_mask * 4 + 4 != lVar3; lVar3 = lVar3 + (uVar2 & 0xffffffff) * 4
        ) {
      dVar5 = (double)*(float *)((long)weights->_begin + lVar3 + 8);
      dVar4 = dVar4 + (double)b->regularizers[((ulong)(lVar3 >> 2) >> (bVar1 & 0x3f)) * 2] * dVar5 *
                      dVar5;
    }
  }
  return dVar4;
}

Assistant:

uint32_t stride() const { return 1 << _stride_shift; }